

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
* __thiscall
Graph::random_two_bridges_search
          (vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
           *__return_storage_ptr__,Graph *this,bool recursive)

{
  bool bVar1;
  reference this_00;
  reference other;
  pointer __args;
  pointer pEVar2;
  bool local_c9;
  __normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_> local_a8
  ;
  int local_9c;
  __normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_> local_98
  ;
  Edge *local_90;
  __normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_> local_88
  ;
  Edge *local_80;
  undefined1 local_78 [8];
  Bridges bridges;
  __normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_> local_58
  ;
  iterator jt;
  iterator it;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> copy;
  bool recursive_local;
  Graph *this_local;
  vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
  *out;
  
  std::
  vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
  ::vector(__return_storage_ptr__);
  clear(this);
  if (recursive) {
    dfsForRandomRecursive(this,0);
  }
  else {
    dfsForRandomIterative(this);
  }
  std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::vector
            ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)&it,&this->edges);
  srs::radixSort((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)&it);
  jt = std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::begin
                 ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)&it);
  do {
    local_58._M_current = jt._M_current;
    bridges.super__Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::end
                            ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)&it);
    bVar1 = __gnu_cxx::operator!=
                      (&jt,(__normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_>
                            *)&bridges.
                               super__Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>::vector
              ((vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_> *)local_78);
    local_88._M_current = local_58._M_current;
    local_90 = (Edge *)std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::end
                                 ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)&it);
    local_80 = (Edge *)std::
                       adjacent_find<__gnu_cxx::__normal_iterator<Graph::Edge*,std::vector<Graph::Edge,std::allocator<Graph::Edge>>>>
                                 (local_88,(__normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_>
                                            )local_90);
    local_58 = (__normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_>
                )local_80;
    jt._M_current = local_80;
    local_98._M_current =
         (Edge *)std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::end
                           ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)&it);
    bVar1 = __gnu_cxx::operator==(&local_58,&local_98);
    if (bVar1) {
      local_9c = 2;
    }
    else {
      while( true ) {
        local_a8._M_current =
             (Edge *)std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::end
                               ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)&it);
        bVar1 = __gnu_cxx::operator!=(&jt,&local_a8);
        local_c9 = false;
        if (bVar1) {
          this_00 = __gnu_cxx::
                    __normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_>
                    ::operator*(&jt);
          other = __gnu_cxx::
                  __normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_>
                  ::operator*(&local_58);
          local_c9 = Edge::operator==(this_00,other);
        }
        if (local_c9 == false) break;
        __args = __gnu_cxx::
                 __normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_>
                 ::operator->(&jt);
        pEVar2 = __gnu_cxx::
                 __normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_>
                 ::operator->(&jt);
        std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>::
        emplace_back<unsigned_long&,unsigned_long&>
                  ((vector<Graph::LightEdge,std::allocator<Graph::LightEdge>> *)local_78,
                   (unsigned_long *)__args,&(pEVar2->super_LightEdge).v);
        __gnu_cxx::
        __normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_>::
        operator++(&jt);
      }
      std::
      vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_78);
      local_9c = 0;
    }
    std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>::~vector
              ((vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_> *)local_78);
  } while (local_9c == 0);
  local_9c = 1;
  std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::~vector
            ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)&it);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Graph::Bridges> Graph::random_two_bridges_search(bool recursive) {
    std::vector<Graph::Bridges> out;
    clear();

    if (recursive)
        dfsForRandomRecursive(0);
    else
        dfsForRandomIterative();

    auto copy = edges;
    srs::radixSort(copy);

    for (auto it = copy.begin(), jt = it; it != copy.end(); jt = it) {
        Graph::Bridges bridges;

        jt = it = std::adjacent_find(jt, copy.end());

        if (jt == copy.end())
            break;

        while (it != copy.end() && *it == *jt) {
            bridges.emplace_back(it->u, it->v);
            ++it;
        }

        out.push_back(bridges);
    }

    return out;
}